

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<test_libaom::AV1CornerMatch::AV1CornerMatchTest>::
TestInfo::~TestInfo(TestInfo *this)

{
  string *in_RDI;
  
  CodeLocation::~CodeLocation((CodeLocation *)0x31868c);
  std::
  unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>_>_>
  ::~unique_ptr((unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>_>_>
                 *)in_RDI);
  std::__cxx11::string::~string(in_RDI + 0x20);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

TestInfo(const char* a_test_suite_base_name, const char* a_test_base_name,
             TestMetaFactoryBase<ParamType>* a_test_meta_factory,
             CodeLocation a_code_location)
        : test_suite_base_name(a_test_suite_base_name),
          test_base_name(a_test_base_name),
          test_meta_factory(a_test_meta_factory),
          code_location(a_code_location) {}